

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O3

void __thiscall QSizeGrip::mousePressEvent(QSizeGrip *this,QMouseEvent *e)

{
  uint uVar1;
  long lVar2;
  QWidget *this_00;
  QWidgetData *pQVar3;
  undefined8 uVar4;
  bool bVar5;
  char cVar6;
  undefined1 uVar7;
  ScrollBarPolicy SVar8;
  int iVar9;
  QWindow *pQVar10;
  long *plVar11;
  QAbstractScrollArea *this_01;
  int iVar12;
  int iVar13;
  undefined4 uVar14;
  int iVar15;
  long in_FS_OFFSET;
  bool bVar16;
  double dVar17;
  double extraout_XMM1_Qa;
  double dVar18;
  QRect QVar19;
  QRect QVar20;
  QVariant QStack_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(e + 0x40) == 1) {
    lVar2 = *(long *)&(this->super_QWidget).field_0x8;
    do {
      uVar1 = (((this->super_QWidget).data)->window_flags).
              super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i;
      if (((uVar1 & 1) != 0) || ((uVar1 & 0xff) == 0x12)) goto LAB_00475299;
      this = *(QSizeGrip **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10);
    } while (&this->super_QWidget != (QWidget *)0x0);
    this = (QSizeGrip *)0x0;
LAB_00475299:
    dVar17 = (double)QEventPoint::globalPosition();
    dVar17 = (double)(((ulong)dVar17 >> 0x20 & 0x80000000) << 0x20 | 0x3fe0000000000000) + dVar17;
    bVar5 = 2147483647.0 < dVar17;
    if (dVar17 <= -2147483648.0) {
      dVar17 = -2147483648.0;
    }
    dVar18 = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM1_Qa;
    bVar16 = 2147483647.0 < dVar18;
    if (dVar18 <= -2147483648.0) {
      dVar18 = -2147483648.0;
    }
    *(ulong *)(lVar2 + 0x254) =
         CONCAT44((int)(double)(-(ulong)bVar16 & 0x41dfffffffc00000 |
                               ~-(ulong)bVar16 & (ulong)dVar18),
                  (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar17)
                 );
    *(undefined1 *)(lVar2 + 0x27c) = 1;
    uVar4 = *(undefined8 *)&(((this->super_QWidget).data)->crect).x2;
    *(undefined8 *)(lVar2 + 0x25c) = *(undefined8 *)&((this->super_QWidget).data)->crect;
    *(undefined8 *)(lVar2 + 0x264) = uVar4;
    *(undefined1 *)(lVar2 + 0x290) = 0;
    if (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      pQVar10 = QWidget::windowHandle(&this->super_QWidget);
      if ((pQVar10 != (QWindow *)0x0) &&
         (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>
           .super_QFlagsStorage<Qt::WindowType>.i & 0x400) == 0)) {
        bVar5 = QWidget::testAttribute_helper(&this->super_QWidget,WA_DontShowOnScreen);
        if (!bVar5) {
          cVar6 = (**(code **)(*(long *)this + 0x88))(this);
          if (cVar6 == '\0') {
            bVar5 = usePlatformSizeGrip(&this->super_QWidget);
            if (bVar5) {
              QWidget::windowHandle(&this->super_QWidget);
              plVar11 = (long *)QWindow::handle();
              uVar14 = 0;
              if ((ulong)*(uint *)(lVar2 + 0x278) < 4) {
                uVar14 = *(undefined4 *)(&DAT_006dcc40 + (ulong)*(uint *)(lVar2 + 0x278) * 4);
              }
              uVar7 = (**(code **)(*plVar11 + 0x138))(plVar11,uVar14);
              *(undefined1 *)(lVar2 + 0x290) = uVar7;
            }
          }
        }
      }
    }
    if (*(char *)(lVar2 + 0x290) == '\0') {
      if (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>
           .super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
        this_00 = *(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10);
        this_01 = (QAbstractScrollArea *)
                  QMetaObject::cast((QObject *)&QAbstractScrollArea::staticMetaObject);
        if (this_01 == (QAbstractScrollArea *)0x0) {
          bVar16 = true;
          bVar5 = true;
        }
        else {
          SVar8 = QAbstractScrollArea::horizontalScrollBarPolicy(this_01);
          bVar16 = SVar8 == ScrollBarAlwaysOff;
          SVar8 = QAbstractScrollArea::verticalScrollBarPolicy(this_01);
          bVar5 = SVar8 == ScrollBarAlwaysOff;
        }
        QVar19 = QWidget::contentsRect(this_00);
      }
      else {
        (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
                  (&QStack_58,QGuiApplicationPrivate::platform_theme,0x25);
        cVar6 = ::QVariant::toBool();
        ::QVariant::~QVariant(&QStack_58);
        if (cVar6 == '\0') {
          QVar19 = QWidgetPrivate::availableScreenGeometry(&this->super_QWidget);
        }
        else {
          QWidget::screen(&this->super_QWidget);
          QVar19 = (QRect)QScreen::availableVirtualGeometry();
        }
        bVar16 = true;
        bVar5 = true;
      }
      QVar20 = QWidget::frameGeometry(&this->super_QWidget);
      pQVar3 = (this->super_QWidget).data;
      iVar15 = (pQVar3->crect).y1.m_i;
      iVar12 = iVar15 - QVar20.y1.m_i;
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      iVar15 = (QVar20.y2.m_i.m_i + iVar15) - (QVar20.y1.m_i.m_i + (pQVar3->crect).y2.m_i + iVar12);
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      iVar13 = ((QVar20.x2.m_i.m_i - QVar20.x1.m_i) - (pQVar3->crect).x2.m_i) +
               (pQVar3->crect).x1.m_i;
      iVar9 = iVar13 / 2;
      if (iVar13 / 2 < 1) {
        iVar9 = 0;
      }
      if ((*(uint *)(lVar2 + 0x278) & 0xfffffffe) == 2) {
        iVar13 = 0x7fffffff;
        if (bVar5) {
          iVar13 = QVar19.y2.m_i.m_i - (iVar15 + *(int *)(lVar2 + 0x268));
        }
      }
      else {
        iVar13 = -0x7fffffff;
        if (bVar5) {
          iVar13 = (iVar12 + QVar19.y1.m_i.m_i) - *(int *)(lVar2 + 0x260);
        }
      }
      *(int *)(lVar2 + 0x274) = iVar13;
      if ((*(uint *)(lVar2 + 0x278) & 0xfffffffd) == 0) {
        if (bVar16) {
          *(int *)(lVar2 + 0x270) = (iVar9 + QVar19.x1.m_i.m_i) - *(int *)(lVar2 + 0x25c);
        }
        else {
          *(undefined4 *)(lVar2 + 0x270) = 0x80000001;
        }
      }
      else if (bVar16) {
        *(int *)(lVar2 + 0x270) = QVar19.x2.m_i.m_i - (iVar9 + *(int *)(lVar2 + 0x264));
      }
      else {
        *(undefined4 *)(lVar2 + 0x270) = 0x7fffffff;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QWidget::mousePressEvent(&this->super_QWidget,e);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSizeGrip::mousePressEvent(QMouseEvent * e)
{
    if (e->button() != Qt::LeftButton) {
        QWidget::mousePressEvent(e);
        return;
    }

    Q_D(QSizeGrip);
    QWidget *tlw = qt_sizegrip_topLevelWidget(this);
    d->p = e->globalPosition().toPoint();
    d->gotMousePress = true;
    d->r = tlw->geometry();

    // Does the platform provide size grip support?
    d->m_platformSizeGrip = false;
    if (tlw->isWindow()
        && tlw->windowHandle()
        && !(tlw->windowFlags() & Qt::X11BypassWindowManagerHint)
        && !tlw->testAttribute(Qt::WA_DontShowOnScreen)
        && !tlw->hasHeightForWidth()
        && usePlatformSizeGrip(tlw)) {
        QPlatformWindow *platformWindow = tlw->windowHandle()->handle();
        const Qt::Edges edges = edgesFromCorner(d->m_corner);
        d->m_platformSizeGrip = platformWindow->startSystemResize(edges);
    }

    if (d->m_platformSizeGrip)
        return;

    // Find available desktop/workspace geometry.
    QRect availableGeometry;
    bool hasVerticalSizeConstraint = true;
    bool hasHorizontalSizeConstraint = true;
    if (tlw->isWindow()) {
        if (QGuiApplicationPrivate::platformTheme()->themeHint(QPlatformTheme::InteractiveResizeAcrossScreens).toBool())
            availableGeometry = tlw->screen()->availableVirtualGeometry();
        else
            availableGeometry = QWidgetPrivate::availableScreenGeometry(tlw);
    }
    else {
        const QWidget *tlwParent = tlw->parentWidget();
        // Check if tlw is inside QAbstractScrollArea/QScrollArea.
        // If that's the case tlw->parentWidget() will return the viewport
        // and tlw->parentWidget()->parentWidget() will return the scroll area.
#if QT_CONFIG(scrollarea)
        QAbstractScrollArea *scrollArea = qobject_cast<QAbstractScrollArea *>(tlwParent->parentWidget());
        if (scrollArea) {
            hasHorizontalSizeConstraint = scrollArea->horizontalScrollBarPolicy() == Qt::ScrollBarAlwaysOff;
            hasVerticalSizeConstraint = scrollArea->verticalScrollBarPolicy() == Qt::ScrollBarAlwaysOff;
        }
#endif // QT_CONFIG(scrollarea)
        availableGeometry = tlwParent->contentsRect();
    }

    // Find frame geometries, title bar height, and decoration sizes.
    const QRect frameGeometry = tlw->frameGeometry();
    const int titleBarHeight = qMax(tlw->geometry().y() - frameGeometry.y(), 0);
    const int bottomDecoration = qMax(frameGeometry.height() - tlw->height() - titleBarHeight, 0);
    const int leftRightDecoration = qMax((frameGeometry.width() - tlw->width()) / 2, 0);

    // Determine dyMax depending on whether the sizegrip is at the bottom
    // of the widget or not.
    if (d->atBottom()) {
        if (hasVerticalSizeConstraint)
            d->dyMax = availableGeometry.bottom() - d->r.bottom() - bottomDecoration;
        else
            d->dyMax = INT_MAX;
    } else {
        if (hasVerticalSizeConstraint)
            d->dyMax = availableGeometry.y() - d->r.y() + titleBarHeight;
        else
            d->dyMax = -INT_MAX;
    }

    // In RTL mode, the size grip is to the left; find dxMax from the desktop/workspace
    // geometry, the size grip geometry and the width of the decoration.
    if (d->atLeft()) {
        if (hasHorizontalSizeConstraint)
            d->dxMax = availableGeometry.x() - d->r.x() + leftRightDecoration;
        else
            d->dxMax = -INT_MAX;
    } else {
        if (hasHorizontalSizeConstraint)
            d->dxMax = availableGeometry.right() - d->r.right() - leftRightDecoration;
        else
            d->dxMax = INT_MAX;
    }
}